

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O1

void __thiscall spvtools::opt::Instruction::UpdateDebugInfoFrom(Instruction *this,Instruction *from)

{
  pointer pIVar1;
  bool bVar2;
  Instruction *i;
  pointer pIVar3;
  
  if (from != (Instruction *)0x0) {
    ClearDbgLineInsts(this);
    pIVar3 = (from->dbg_line_insts_).
             super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((from->dbg_line_insts_).
        super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
        _M_impl.super__Vector_impl_data._M_start != pIVar3) {
      AddDebugLine(this,pIVar3 + -1);
    }
    this->dbg_scope_ = from->dbg_scope_;
    pIVar1 = (this->dbg_line_insts_).
             super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pIVar3 = (this->dbg_line_insts_).
                  super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                  ._M_impl.super__Vector_impl_data._M_start; pIVar3 != pIVar1; pIVar3 = pIVar3 + 1)
    {
      pIVar3->dbg_scope_ = from->dbg_scope_;
    }
    bVar2 = IsLineInst(this);
    if ((!bVar2) && ((this->context_->valid_analyses_ & kAnalysisDebugInfo) != kAnalysisNone)) {
      analysis::DebugInfoManager::AnalyzeDebugInst
                ((this->context_->debug_info_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::analysis::DebugInfoManager,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                 .super__Head_base<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_false>.
                 _M_head_impl,this);
      return;
    }
  }
  return;
}

Assistant:

void Instruction::UpdateDebugInfoFrom(const Instruction* from) {
  if (from == nullptr) return;
  ClearDbgLineInsts();
  if (!from->dbg_line_insts().empty())
    AddDebugLine(&from->dbg_line_insts().back());
  SetDebugScope(from->GetDebugScope());
  if (!IsLineInst() &&
      context()->AreAnalysesValid(IRContext::kAnalysisDebugInfo)) {
    context()->get_debug_info_mgr()->AnalyzeDebugInst(this);
  }
}